

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s5.c
# Opt level: O2

s5_err s5_parse(s5_ctx *cx,uint8_t **data,size_t *size)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  size_t sVar5;
  s5_err sVar6;
  s5_err sVar7;
  uint8_t uVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  size_t sVar12;
  
  puVar4 = *data;
  sVar5 = *size;
  sVar6 = s5_bad_version;
  sVar12 = 0;
  for (sVar9 = 1; sVar10 = sVar5, sVar7 = s5_ok, sVar9 - sVar5 != 1; sVar9 = sVar9 + 1) {
    if (0x10 < cx->state) {
      abort();
    }
    bVar1 = puVar4[sVar9 - 1];
    uVar11 = (uint)bVar1;
    sVar12 = sVar12 + 1;
    sVar10 = sVar12;
    sVar7 = sVar6;
    switch(cx->state) {
    case '\0':
      sVar10 = sVar9;
      if (bVar1 != 5) goto LAB_0010f64a;
      cx->state = '\x01';
      break;
    case '\x01':
      cx->arg0 = 0;
      cx->arg1 = uVar11;
      cx->state = '\x02';
      break;
    case '\x02':
      uVar11 = cx->arg0;
      if (uVar11 < cx->arg1) {
        if (bVar1 < 3) {
          cx->methods = cx->methods | (byte)(0x40201 >> ((bVar1 & 3) << 3));
        }
        uVar11 = uVar11 + 1;
        cx->arg0 = uVar11;
      }
      if (uVar11 == cx->arg1) {
        sVar7 = s5_auth_select;
        goto LAB_0010f64a;
      }
      break;
    case '\x03':
      if (bVar1 != 1) goto LAB_0010f64a;
      cx->state = '\x04';
      break;
    case '\x04':
      cx->arg0 = 0;
      cx->userlen = bVar1;
      cx->state = '\x05';
      break;
    case '\x05':
      uVar11 = cx->arg0;
      bVar2 = cx->userlen;
      if (uVar11 < bVar2) {
        cx->username[uVar11] = bVar1;
        uVar11 = uVar11 + 1;
        cx->arg0 = uVar11;
      }
      if (uVar11 == bVar2) {
        cx->username[bVar2] = '\0';
        cx->state = '\x06';
      }
      break;
    case '\x06':
      cx->arg0 = 0;
      cx->passlen = bVar1;
      cx->state = '\a';
      break;
    case '\a':
      uVar11 = cx->arg0;
      bVar2 = cx->passlen;
      if (uVar11 < bVar2) {
        cx->password[uVar11] = bVar1;
        uVar11 = uVar11 + 1;
        cx->arg0 = uVar11;
      }
      if (uVar11 == bVar2) {
        cx->password[bVar2] = '\0';
        sVar7 = s5_auth_verify;
        uVar8 = '\b';
        goto LAB_0010f690;
      }
      break;
    case '\b':
      if (bVar1 != 5) goto LAB_0010f64a;
      cx->state = '\t';
      break;
    case '\t':
      if (uVar11 == 1) {
        uVar8 = '\0';
      }
      else {
        if (uVar11 != 3) {
          sVar7 = s5_bad_cmd;
          goto LAB_0010f64a;
        }
        uVar8 = '\x02';
      }
      cx->cmd = uVar8;
      cx->state = '\n';
      break;
    case '\n':
      cx->state = '\v';
      break;
    case '\v':
      cx->arg0 = 0;
      if (uVar11 == 4) {
        cx->state = '\r';
        cx->atyp = '\x01';
        cx->arg1 = 0x10;
      }
      else if (uVar11 == 3) {
        cx->state = '\f';
        cx->atyp = '\x02';
        cx->arg1 = 0;
      }
      else {
        if (uVar11 != 1) {
          sVar7 = s5_bad_atyp;
          goto LAB_0010f64a;
        }
        cx->state = '\r';
        cx->atyp = '\0';
        cx->arg1 = 4;
      }
      break;
    case '\f':
      cx->arg1 = uVar11;
      cx->state = '\r';
      break;
    case '\r':
      uVar11 = cx->arg0;
      uVar3 = cx->arg1;
      if (uVar11 < uVar3) {
        cx->daddr[uVar11] = bVar1;
        uVar11 = uVar11 + 1;
        cx->arg0 = uVar11;
      }
      if (uVar11 == uVar3) {
        cx->daddr[uVar3] = '\0';
        cx->state = '\x0e';
      }
      break;
    case '\x0e':
      cx->dport = (ushort)bVar1 << 8;
      cx->state = '\x0f';
      break;
    case '\x0f':
      cx->dport = cx->dport | (ushort)bVar1;
      sVar7 = s5_exec_cmd;
      uVar8 = '\x10';
LAB_0010f690:
      cx->state = uVar8;
      sVar10 = sVar9;
      goto LAB_0010f64a;
    }
  }
LAB_0010f64a:
  *data = puVar4 + sVar10;
  *size = sVar5 - sVar10;
  return sVar7;
}

Assistant:

s5_err s5_parse(s5_ctx *cx, uint8_t **data, size_t *size) {
  s5_err err;
  uint8_t *p;
  uint8_t c;
  size_t i;
  size_t n;

  p = *data;
  n = *size;
  i = 0;

  while (i < n) {
    c = p[i];
    i += 1;
    switch (cx->state) {
      case s5_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_nmethods;
        break;

      case s5_nmethods:
        cx->arg0 = 0;
        cx->arg1 = c;  /* Number of bytes to read. */
        cx->state = s5_methods;
        break;

      case s5_methods:
        if (cx->arg0 < cx->arg1) {
          switch (c) {
            case 0:
              cx->methods |= S5_AUTH_NONE;
              break;
            case 1:
              cx->methods |= S5_AUTH_GSSAPI;
              break;
            case 2:
              cx->methods |= S5_AUTH_PASSWD;
              break;
            /* Ignore everything we don't understand. */
          }
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          err = s5_auth_select;
          goto out;
        }
        break;

      case s5_auth_pw_version:
        if (c != 1) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_auth_pw_userlen;
        break;

      case s5_auth_pw_userlen:
        cx->arg0 = 0;
        cx->userlen = c;
        cx->state = s5_auth_pw_username;
        break;

      case s5_auth_pw_username:
        if (cx->arg0 < cx->userlen) {
          cx->username[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->userlen) {
          cx->username[cx->userlen] = '\0';
          cx->state = s5_auth_pw_passlen;
        }
        break;

      case s5_auth_pw_passlen:
        cx->arg0 = 0;
        cx->passlen = c;
        cx->state = s5_auth_pw_password;
        break;

      case s5_auth_pw_password:
        if (cx->arg0 < cx->passlen) {
          cx->password[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->passlen) {
          cx->password[cx->passlen] = '\0';
          cx->state = s5_req_version;
          err = s5_auth_verify;
          goto out;
        }
        break;

      case s5_req_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_req_cmd;
        break;

      case s5_req_cmd:
        switch (c) {
          case 1:  /* TCP connect */
            cx->cmd = s5_cmd_tcp_connect;
            break;
          case 3:  /* UDP associate */
            cx->cmd = s5_cmd_udp_assoc;
            break;
          default:
            err = s5_bad_cmd;
            goto out;
        }
        cx->state = s5_req_reserved;
        break;

      case s5_req_reserved:
        cx->state = s5_req_atyp;
        break;

      case s5_req_atyp:
        cx->arg0 = 0;
        switch (c) {
          case 1:  /* IPv4, four octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv4;
            cx->arg1 = 4;
            break;
          case 3:  /* Hostname.  First byte is length. */
            cx->state = s5_req_atyp_host;
            cx->atyp = s5_atyp_host;
            cx->arg1 = 0;
            break;
          case 4:  /* IPv6, sixteen octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv6;
            cx->arg1 = 16;
            break;
          default:
            err = s5_bad_atyp;
            goto out;
        }
        break;

      case s5_req_atyp_host:
        cx->arg1 = c;
        cx->state = s5_req_daddr;
        break;

      case s5_req_daddr:
        if (cx->arg0 < cx->arg1) {
          cx->daddr[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          cx->daddr[cx->arg1] = '\0';
          cx->state = s5_req_dport0;
        }
        break;

      case s5_req_dport0:
        cx->dport = c << 8;
        cx->state = s5_req_dport1;
        break;

      case s5_req_dport1:
        cx->dport |= c;
        cx->state = s5_dead;
        err = s5_exec_cmd;
        goto out;

      case s5_dead:
        break;

      default:
        abort();
    }
  }
  err = s5_ok;

out:
  *data = p + i;
  *size = n - i;
  return err;
}